

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O2

int __thiscall jrtplib::RTPPacketBuilder::DeleteCSRC(RTPPacketBuilder *this,uint32_t csrc)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  if (this->init == true) {
    iVar2 = this->numcsrcs;
    bVar4 = false;
    for (uVar3 = 0; (!bVar4 && ((int)uVar3 < iVar2)); uVar3 = uVar3 + !bVar4) {
      bVar4 = this->csrcs[uVar3] == csrc;
    }
    if (bVar4) {
      uVar1 = iVar2 - 1;
      this->numcsrcs = uVar1;
      if ((1 < iVar2) && (uVar1 != uVar3)) {
        this->csrcs[uVar3] = this->csrcs[uVar1];
      }
      return 0;
    }
    iVar2 = -0xf;
  }
  else {
    iVar2 = -0x14;
  }
  return iVar2;
}

Assistant:

int RTPPacketBuilder::DeleteCSRC(uint32_t csrc)
{
	if (!init)
		return ERR_RTP_PACKBUILD_NOTINIT;
	
	int i = 0;
	bool found = false;

	while (!found && i < numcsrcs)
	{
		if (csrcs[i] == csrc)
			found = true;
		else
			i++;
	}

	if (!found)
		return ERR_RTP_PACKBUILD_CSRCNOTINLIST;
	
	// move the last csrc in the place of the deleted one
	numcsrcs--;
	if (numcsrcs > 0 && numcsrcs != i)
		csrcs[i] = csrcs[numcsrcs];
	return 0;
}